

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O3

int encodeSignatureBits(uint8_t *sig)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint8_t *puVar10;
  size_t __n;
  
  pbVar1 = sig + 0x28;
  iVar9 = 0x21;
  iVar7 = 0x21;
  if (-1 < (char)sig[8]) {
    iVar7 = 0x20;
    lVar8 = -0x1f;
    bVar2 = sig[8];
    do {
      lVar6 = lVar8 + 0x28;
      if ((sig[lVar6] & 0x80) != 0 || bVar2 != 0) goto LAB_00102bd7;
      iVar7 = iVar7 + -1;
      lVar8 = lVar8 + 1;
      bVar2 = sig[lVar6];
    } while (lVar8 != 0);
    iVar7 = 1;
  }
LAB_00102bd7:
  if (-1 < (char)*pbVar1) {
    iVar9 = 0x20;
    lVar8 = -0x1f;
    bVar2 = *pbVar1;
    do {
      lVar6 = lVar8 + 0x48;
      if ((sig[lVar6] & 0x80) != 0 || bVar2 != 0) goto LAB_00102c0e;
      iVar9 = iVar9 + -1;
      lVar8 = lVar8 + 1;
      bVar2 = sig[lVar6];
    } while (lVar8 != 0);
    iVar9 = 1;
  }
LAB_00102c0e:
  *sig = '0';
  sig[1] = (uint8_t)iVar7 + (uint8_t)iVar9 + '\x04';
  sig[2] = '\x02';
  sig[3] = (uint8_t)iVar7;
  if (iVar7 == 0x21) {
    sig[4] = '\0';
    *(undefined8 *)(sig + 0x15) = *(undefined8 *)(sig + 0x18);
    *(undefined8 *)(sig + 0x1d) = *(undefined8 *)(sig + 0x20);
    *(undefined8 *)(sig + 5) = *(undefined8 *)(sig + 8);
    *(undefined8 *)(sig + 0xd) = *(undefined8 *)(sig + 0x10);
    puVar10 = sig + 0x25;
  }
  else {
    __n = (size_t)iVar7;
    memmove(sig + 4,pbVar1 + -__n,__n);
    puVar10 = sig + 4 + __n;
  }
  *puVar10 = '\x02';
  puVar10[1] = (uint8_t)iVar9;
  if (iVar9 == 0x21) {
    puVar10[2] = '\0';
    uVar3 = *(undefined8 *)pbVar1;
    uVar4 = *(undefined8 *)(sig + 0x30);
    uVar5 = *(undefined8 *)(sig + 0x40);
    *(undefined8 *)(puVar10 + 0x13) = *(undefined8 *)(sig + 0x38);
    *(undefined8 *)(puVar10 + 0x1b) = uVar5;
    *(undefined8 *)(puVar10 + 3) = uVar3;
    *(undefined8 *)(puVar10 + 0xb) = uVar4;
    iVar9 = (int)puVar10 + 0x23;
  }
  else {
    memmove(puVar10 + 2,sig + (0x48 - (long)iVar9),(long)iVar9);
    iVar9 = (int)(puVar10 + 2) + iVar9;
  }
  return iVar9 - (int)sig;
}

Assistant:

static int
encodeSignatureBits(uint8_t* sig)
{
  const uint8_t* begin = sig;
  const uint8_t* r = sig + 8;
  const uint8_t* s = r + 32;
  int rLength = determineAsn1IntLength(r);
  int sLength = determineAsn1IntLength(s);

  *(sig++) = ASN1_SEQUENCE;
  *(sig++) = 2 + rLength + 2 + sLength;
  sig = writeAsn1Int(sig, r, rLength);
  sig = writeAsn1Int(sig, s, sLength);

  return sig - begin;
}